

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApertureILS.cpp
# Opt level: O0

void __thiscall
imrt::ApertureILS::ApertureILS
          (ApertureILS *this,int bsize,int vsize,bool search_intensity,bool search_aperture,
          double prob_intensity,int step_intensity,double initial_temperature,double alpha,
          bool do_perturbate,int perturbation_size,int acceptance,int ls_type)

{
  byte in_CL;
  int in_EDX;
  int in_ESI;
  ILS *in_RDI;
  byte in_R8B;
  undefined4 in_R9D;
  _func_int **in_XMM0_Qa;
  clock_t in_XMM1_Qa;
  _func_int **in_XMM2_Qa;
  byte in_stack_00000008;
  undefined4 in_stack_00000010;
  int in_stack_00000018;
  
  ILS::ILS(in_RDI,in_ESI,in_EDX,in_stack_00000018);
  in_RDI->_vptr_ILS = (_func_int **)&PTR__ApertureILS_001a2c50;
  in_RDI->field_0x24 = in_CL & 1;
  in_RDI->field_0x25 = in_R8B & 1;
  in_RDI[1]._vptr_ILS = in_XMM0_Qa;
  *(undefined4 *)&in_RDI[1].max_no_improvement = in_R9D;
  *(undefined4 *)((long)&in_RDI[1].max_no_improvement + 4) = alpha._0_4_;
  in_RDI[1].bsize = (int)in_XMM1_Qa;
  in_RDI[1].vsize = (int)((ulong)in_XMM1_Qa >> 0x20);
  in_RDI[2]._vptr_ILS = in_XMM2_Qa;
  *(undefined4 *)&in_RDI[2].max_no_improvement = in_stack_00000010;
  *(byte *)((long)&in_RDI[2].max_no_improvement + 4) = in_stack_00000008 & 1;
  std::__cxx11::
  list<std::pair<imrt::Station_*,_int>,_std::allocator<std::pair<imrt::Station_*,_int>_>_>::list
            ((list<std::pair<imrt::Station_*,_int>,_std::allocator<std::pair<imrt::Station_*,_int>_>_>
              *)0x15e966);
  in_RDI[1].time_begin = in_XMM1_Qa;
  return;
}

Assistant:

ApertureILS::ApertureILS(int bsize, int vsize, bool search_intensity, bool search_aperture, 
                         double prob_intensity, int step_intensity , double initial_temperature,  
                         double alpha, bool do_perturbate, int perturbation_size, int acceptance=0, 
                         int ls_type=ApertureILS::FIRST_IMPROVEMENT): 
                         ILS(bsize, vsize, acceptance), search_intensity(search_intensity), 
                         search_aperture(search_aperture), prob_intensity(prob_intensity), 
                         step_intensity(step_intensity) , initial_temperature(initial_temperature), 
                         alpha(alpha), do_perturbate(do_perturbate), perturbation_size(perturbation_size), 
                         ls_type(ls_type){
//  cout << "per:" << perturbation_size << endl;
  temperature=initial_temperature;
}